

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O0

void transaction_in_memory_snapshot_test(void)

{
  void *thread_ret;
  pthread_t tid;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char bodybuf [256];
  char keybuf [256];
  fdb_status status;
  fdb_kvs_handle *db_txn1;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile_txn1;
  fdb_file_handle *dbfile;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_file_handle *in_stack_fffffffffffffc18;
  fdb_file_handle *in_stack_fffffffffffffc20;
  fdb_file_handle *in_stack_fffffffffffffc28;
  char *in_stack_fffffffffffffc30;
  fdb_commit_opt_t opt;
  fdb_kvs_handle *in_stack_fffffffffffffc38;
  char *in_stack_fffffffffffffc40;
  size_t in_stack_fffffffffffffc48;
  char *in_stack_fffffffffffffc50;
  fdb_kvs_handle *in_stack_fffffffffffffc58;
  pthread_t local_3a0 [5];
  undefined8 local_378;
  undefined8 local_370;
  undefined4 local_364;
  undefined4 local_35c;
  undefined1 local_351;
  char local_288 [192];
  fdb_config *in_stack_fffffffffffffe38;
  char *in_stack_fffffffffffffe40;
  fdb_file_handle **in_stack_fffffffffffffe48;
  char local_188 [260];
  fdb_status local_84;
  fdb_file_handle *local_80;
  fdb_kvs_handle *local_78;
  int local_5c;
  int local_58;
  uint local_54;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  memleak_start();
  local_5c = 10;
  local_58 = system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  local_378 = 0;
  local_370 = 0x400;
  local_35c = 1;
  local_364 = 0;
  local_351 = 0;
  fdb_open(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  fdb_kvs_open_default
            (in_stack_fffffffffffffc20,&in_stack_fffffffffffffc18->root,(fdb_kvs_config *)0x119692);
  local_84 = fdb_set_log_callback(local_78,logCallbackFunc,"transaction_in_memory_snapshot_test");
  if (local_84 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdf4);
    transaction_in_memory_snapshot_test::__test_pass = 0;
    if (local_84 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xdf4,"void transaction_in_memory_snapshot_test()");
    }
  }
  local_54 = 0;
  do {
    if (local_5c <= (int)local_54) {
      fdb_commit(in_stack_fffffffffffffc18,'\0');
      fdb_open(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      fdb_kvs_open_default
                (in_stack_fffffffffffffc20,&in_stack_fffffffffffffc18->root,
                 (fdb_kvs_config *)0x11989a);
      fdb_begin_transaction
                (in_stack_fffffffffffffc28,
                 (fdb_isolation_level_t)((ulong)in_stack_fffffffffffffc20 >> 0x38));
      for (local_54 = 10; opt = (fdb_commit_opt_t)((ulong)in_stack_fffffffffffffc30 >> 0x38),
          (int)local_54 < 10000; local_54 = local_54 + 1) {
        sprintf(local_188,"key%d",(ulong)local_54);
        sprintf(local_288,"body%d_txn1",(ulong)local_54);
        in_stack_fffffffffffffc18 = local_80;
        strlen(local_188);
        in_stack_fffffffffffffc30 = local_288;
        strlen(local_288);
        fdb_set_kv(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
                   in_stack_fffffffffffffc40,(size_t)in_stack_fffffffffffffc38);
      }
      pthread_create(local_3a0,(pthread_attr_t *)0x0,in_memory_snapshot_thread,local_78);
      fdb_end_transaction((fdb_file_handle *)in_stack_fffffffffffffc38,opt);
      pthread_join(local_3a0[0],(void **)&stack0xfffffffffffffc58);
      fdb_close(in_stack_fffffffffffffc18);
      fdb_close(in_stack_fffffffffffffc18);
      fdb_shutdown();
      memleak_end();
      if (transaction_in_memory_snapshot_test::__test_pass == 0) {
        fprintf(_stderr,"%s FAILED\n","transaction and in-memory snapshot interleaving test");
      }
      else {
        fprintf(_stderr,"%s PASSED\n","transaction and in-memory snapshot interleaving test");
      }
      return;
    }
    sprintf(local_188,"key%d",(ulong)local_54);
    sprintf(local_288,"body%d",(ulong)local_54);
    in_stack_fffffffffffffc40 = local_188;
    in_stack_fffffffffffffc38 = local_78;
    in_stack_fffffffffffffc48 = strlen(local_188);
    in_stack_fffffffffffffc50 = local_288;
    strlen(local_288);
    local_84 = fdb_set_kv(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
                          in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                          (size_t)in_stack_fffffffffffffc38);
    if (local_84 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xdfc);
      transaction_in_memory_snapshot_test::__test_pass = 0;
      if (local_84 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xdfc,"void transaction_in_memory_snapshot_test()");
      }
    }
    local_54 = local_54 + 1;
  } while( true );
}

Assistant:

void transaction_in_memory_snapshot_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    fdb_file_handle *dbfile, *dbfile_txn1;
    fdb_kvs_handle *db, *db_txn1;
    fdb_status status;

    char keybuf[256], bodybuf[256];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 0;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./mvcc_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "transaction_in_memory_snapshot_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert the first set of key-value pairs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf), bodybuf,
                            strlen(bodybuf));
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // open db and begin a transaction
    fdb_open(&dbfile_txn1, "./mvcc_test1", &fconfig);
    fdb_kvs_open_default(dbfile_txn1, &db_txn1, &kvs_config);
    fdb_begin_transaction(dbfile_txn1, FDB_ISOLATION_READ_COMMITTED);

    // concurrently update docs
    for (i=10;i<10000;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d_txn1", i);
        fdb_set_kv(db_txn1, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
    }

    // Create in-memory snapshot thread
    thread_t tid;
    void *thread_ret;
    thread_create(&tid, in_memory_snapshot_thread, (void *)db);

    // commit txn1
    fdb_end_transaction(dbfile_txn1, FDB_COMMIT_NORMAL);

    thread_join(tid, &thread_ret);

    // close db file
    fdb_close(dbfile);
    fdb_close(dbfile_txn1);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("transaction and in-memory snapshot interleaving test");
}